

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

string * __thiscall
cmLocalGenerator::GetObjectFileNameWithoutTarget
          (string *__return_storage_ptr__,cmLocalGenerator *this,cmSourceFile *source,
          string *dir_max,bool *hasSourceExtension,char *customOutputExtension)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  string *psVar4;
  char *pcVar5;
  ulong uVar6;
  cmGlobalGenerator *this_00;
  cmake *this_01;
  ulong uVar7;
  bool local_1d2;
  bool local_1ba;
  string local_1a0;
  string local_180 [32];
  long local_160;
  size_type dot_pos;
  undefined1 local_150 [8];
  string repVar;
  string lang;
  undefined1 local_108 [6];
  bool replaceExt;
  byte local_e1;
  undefined1 local_e0 [7];
  bool keptSourceExtension;
  undefined1 local_c0 [8];
  string objectName;
  undefined1 local_98 [6];
  bool subBinary;
  bool relBinary;
  string relFromBinary;
  bool subSource;
  undefined1 local_60 [7];
  bool relSource;
  string relFromSource;
  string *fullPath;
  char *customOutputExtension_local;
  bool *hasSourceExtension_local;
  string *dir_max_local;
  cmSourceFile *source_local;
  cmLocalGenerator *this_local;
  
  relFromSource.field_2._8_8_ = cmSourceFile::GetFullPath_abi_cxx11_(source);
  psVar4 = GetCurrentSourceDirectory_abi_cxx11_(this);
  MaybeConvertToRelativePath((string *)local_60,this,psVar4,(string *)relFromSource.field_2._8_8_);
  bVar1 = std::__cxx11::string::empty();
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!relFromSource.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmLocalGenerator.cxx"
                  ,0xa1e,
                  "std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(const cmSourceFile &, const std::string &, bool *, const char *)"
                 );
  }
  bVar2 = cmsys::SystemTools::FileIsFullPath((string *)local_60);
  bVar1 = (bVar2 ^ 0xffU) & 1;
  local_1ba = false;
  if (bVar1 != 0) {
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_60);
    local_1ba = *pcVar5 != '.';
  }
  relFromBinary.field_2._M_local_buf[0xb] = local_1ba;
  psVar4 = GetCurrentBinaryDirectory_abi_cxx11_(this);
  MaybeConvertToRelativePath((string *)local_98,this,psVar4,(string *)relFromSource.field_2._8_8_);
  bVar3 = std::__cxx11::string::empty();
  if (((bVar3 ^ 0xff) & 1) != 0) {
    bVar2 = cmsys::SystemTools::FileIsFullPath((string *)local_98);
    objectName.field_2._M_local_buf[0xf] = (bVar2 ^ 0xffU) & 1;
    local_1d2 = false;
    if (objectName.field_2._M_local_buf[0xf] != 0) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_98);
      local_1d2 = *pcVar5 != '.';
    }
    objectName.field_2._M_local_buf[0xe] = local_1d2;
    std::__cxx11::string::string((string *)local_c0);
    if (((bVar1 == 0) || ((objectName.field_2._M_local_buf[0xf] & 1U) != 0)) &&
       (((relFromBinary.field_2._M_local_buf[0xb] & 1U) == 0 ||
        ((objectName.field_2._M_local_buf[0xe] & 1U) != 0)))) {
      if ((((objectName.field_2._M_local_buf[0xf] & 1U) == 0) || (bVar1 != 0)) &&
         (((objectName.field_2._M_local_buf[0xe] & 1U) == 0 ||
          ((relFromBinary.field_2._M_local_buf[0xb] & 1U) != 0)))) {
        uVar7 = std::__cxx11::string::length();
        uVar6 = std::__cxx11::string::length();
        if (uVar7 < uVar6) {
          std::__cxx11::string::operator=((string *)local_c0,(string *)local_98);
        }
        else {
          std::__cxx11::string::operator=((string *)local_c0,(string *)local_60);
        }
      }
      else {
        std::__cxx11::string::operator=((string *)local_c0,(string *)local_98);
      }
    }
    else {
      std::__cxx11::string::operator=((string *)local_c0,(string *)local_60);
    }
    bVar2 = cmsys::SystemTools::FileIsFullPath((string *)local_c0);
    if (bVar2) {
      this_00 = GetGlobalGenerator(this);
      this_01 = cmGlobalGenerator::GetCMakeInstance(this_00);
      bVar2 = cmake::GetIsInTryCompile(this_01);
      if (bVar2) {
        psVar4 = cmSourceFile::GetFullPath_abi_cxx11_(source);
        cmsys::SystemTools::GetFilenameName((string *)local_e0,psVar4);
        std::__cxx11::string::operator=((string *)local_c0,(string *)local_e0);
        std::__cxx11::string::~string((string *)local_e0);
      }
    }
    local_e1 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_108,"KEEP_EXTENSION",
               (allocator<char> *)(lang.field_2._M_local_buf + 0xf));
    bVar2 = cmSourceFile::GetPropertyAsBool(source,(string *)local_108);
    std::__cxx11::string::~string((string *)local_108);
    std::allocator<char>::~allocator((allocator<char> *)(lang.field_2._M_local_buf + 0xf));
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      lang.field_2._M_local_buf[0xe] = NeedBackwardsCompatibility_2_4(this);
      if (!(bool)lang.field_2._M_local_buf[0xe]) {
        cmSourceFile::GetLanguage_abi_cxx11_((string *)((long)&repVar.field_2 + 8),source);
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_150,"CMAKE_",(allocator<char> *)((long)&dot_pos + 7));
          std::allocator<char>::~allocator((allocator<char> *)((long)&dot_pos + 7));
          std::__cxx11::string::operator+=
                    ((string *)local_150,(string *)(repVar.field_2._M_local_buf + 8));
          std::__cxx11::string::operator+=((string *)local_150,"_OUTPUT_EXTENSION_REPLACE");
          lang.field_2._M_local_buf[0xe] = cmMakefile::IsOn(this->Makefile,(string *)local_150);
          std::__cxx11::string::~string((string *)local_150);
        }
        std::__cxx11::string::~string((string *)(repVar.field_2._M_local_buf + 8));
      }
      if (((lang.field_2._M_local_buf[0xe] & 1U) != 0) || (customOutputExtension != (char *)0x0)) {
        local_e1 = 0;
        local_160 = std::__cxx11::string::rfind((char)local_c0,0x2e);
        if (local_160 != -1) {
          std::__cxx11::string::substr((ulong)local_180,(ulong)local_c0);
          std::__cxx11::string::operator=((string *)local_c0,local_180);
          std::__cxx11::string::~string(local_180);
        }
      }
      if (customOutputExtension == (char *)0x0) {
        cmGlobalGenerator::GetLanguageOutputExtension_abi_cxx11_
                  (&local_1a0,this->GlobalGenerator,source);
        std::__cxx11::string::operator+=((string *)local_c0,(string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_1a0);
      }
      else {
        std::__cxx11::string::operator+=((string *)local_c0,customOutputExtension);
      }
    }
    if (hasSourceExtension != (bool *)0x0) {
      *hasSourceExtension = (bool)(local_e1 & 1);
    }
    psVar4 = CreateSafeUniqueObjectFileName(this,(string *)local_c0,dir_max);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar4);
    std::__cxx11::string::~string((string *)local_c0);
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string((string *)local_60);
    return __return_storage_ptr__;
  }
  __assert_fail("!relFromBinary.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmLocalGenerator.cxx"
                ,0xa25,
                "std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(const cmSourceFile &, const std::string &, bool *, const char *)"
               );
}

Assistant:

std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(
  const cmSourceFile& source, std::string const& dir_max,
  bool* hasSourceExtension, char const* customOutputExtension)
{
  // Construct the object file name using the full path to the source
  // file which is its only unique identification.
  std::string const& fullPath = source.GetFullPath();

  // Try referencing the source relative to the source tree.
  std::string relFromSource = this->MaybeConvertToRelativePath(
    this->GetCurrentSourceDirectory(), fullPath);
  assert(!relFromSource.empty());
  bool relSource = !cmSystemTools::FileIsFullPath(relFromSource);
  bool subSource = relSource && relFromSource[0] != '.';

  // Try referencing the source relative to the binary tree.
  std::string relFromBinary = this->MaybeConvertToRelativePath(
    this->GetCurrentBinaryDirectory(), fullPath);
  assert(!relFromBinary.empty());
  bool relBinary = !cmSystemTools::FileIsFullPath(relFromBinary);
  bool subBinary = relBinary && relFromBinary[0] != '.';

  // Select a nice-looking reference to the source file to construct
  // the object file name.
  std::string objectName;
  if ((relSource && !relBinary) || (subSource && !subBinary)) {
    objectName = relFromSource;
  } else if ((relBinary && !relSource) || (subBinary && !subSource)) {
    objectName = relFromBinary;
  } else if (relFromBinary.length() < relFromSource.length()) {
    objectName = relFromBinary;
  } else {
    objectName = relFromSource;
  }

  // if it is still a full path check for the try compile case
  // try compile never have in source sources, and should not
  // have conflicting source file names in the same target
  if (cmSystemTools::FileIsFullPath(objectName)) {
    if (this->GetGlobalGenerator()->GetCMakeInstance()->GetIsInTryCompile()) {
      objectName = cmSystemTools::GetFilenameName(source.GetFullPath());
    }
  }

  // Replace the original source file extension with the object file
  // extension.
  bool keptSourceExtension = true;
  if (!source.GetPropertyAsBool("KEEP_EXTENSION")) {
    // Decide whether this language wants to replace the source
    // extension with the object extension.  For CMake 2.4
    // compatibility do this by default.
    bool replaceExt = this->NeedBackwardsCompatibility_2_4();
    if (!replaceExt) {
      std::string lang = source.GetLanguage();
      if (!lang.empty()) {
        std::string repVar = "CMAKE_";
        repVar += lang;
        repVar += "_OUTPUT_EXTENSION_REPLACE";
        replaceExt = this->Makefile->IsOn(repVar);
      }
    }

    // Remove the source extension if it is to be replaced.
    if (replaceExt || customOutputExtension) {
      keptSourceExtension = false;
      std::string::size_type dot_pos = objectName.rfind('.');
      if (dot_pos != std::string::npos) {
        objectName = objectName.substr(0, dot_pos);
      }
    }

    // Store the new extension.
    if (customOutputExtension) {
      objectName += customOutputExtension;
    } else {
      objectName += this->GlobalGenerator->GetLanguageOutputExtension(source);
    }
  }
  if (hasSourceExtension) {
    *hasSourceExtension = keptSourceExtension;
  }

  // Convert to a safe name.
  return this->CreateSafeUniqueObjectFileName(objectName, dir_max);
}